

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_misc.cpp
# Opt level: O0

void Am_Draw_Rect_Border(am_rect r,Am_Style *upper_left,Am_Style *lower_right,Am_Drawonable *draw)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  Am_Drawonable *draw_local;
  Am_Style *lower_right_local;
  Am_Style *upper_left_local;
  am_rect r_local;
  
  uVar3 = r._0_8_;
  r_local.left = r.width;
  iVar1 = r_local.left + -1;
  r_local.top = r.height;
  iVar2 = r_local.top + -1;
  upper_left_local._0_4_ = r.left;
  upper_left_local._4_4_ = r.top;
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,upper_left,&Am_No_Style,uVar3 & 0xffffffff,
             (ulong)((upper_left_local._4_4_ + iVar2) - 1),uVar3 & 0xffffffff,upper_left_local._4_4_
             ,(int)upper_left_local + iVar1 + -1,upper_left_local._4_4_,0);
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,lower_right,&Am_No_Style,uVar3 & 0xffffffff,
             (ulong)(uint)(upper_left_local._4_4_ + iVar2),
             (ulong)(uint)((int)upper_left_local + iVar1),upper_left_local._4_4_ + iVar2,
             (int)upper_left_local + iVar1,upper_left_local._4_4_,0);
  return;
}

Assistant:

void
Am_Draw_Rect_Border(am_rect r, Am_Style upper_left, Am_Style lower_right,
                    Am_Drawonable *draw)
{
  r.width -= 1;
  r.height -= 1;
  draw->Draw_2_Lines(upper_left, Am_No_Style, r.left, r.top + r.height - 1,
                     r.left, r.top, r.left + r.width - 1, r.top);
  draw->Draw_2_Lines(lower_right, Am_No_Style, r.left, r.top + r.height,
                     r.left + r.width, r.top + r.height, r.left + r.width,
                     r.top);
}